

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receiver_cluster.hpp
# Opt level: O1

void cluster_preprocess(int n,vec3f *positions,int *clusterids,SphereTree *hierarchy,int *sphcnt)

{
  pointer ppVar1;
  data_t dVar2;
  undefined8 uVar3;
  pointer pfVar4;
  long lVar5;
  undefined1 auVar6 [8];
  uint uVar7;
  int iVar8;
  float *data;
  float *data_00;
  ulong uVar9;
  undefined8 *puVar10;
  ulong uVar11;
  float *pfVar12;
  int iVar13;
  data_t *pdVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  float *pfVar18;
  float *pfVar19;
  int k;
  long lVar20;
  void *pvVar21;
  int c;
  float fVar22;
  float fVar23;
  vec3f cluster_center;
  undefined8 uStack_110;
  undefined8 auStack_108 [2];
  float afStack_f8 [2];
  undefined1 local_f0 [8];
  vector<int,_std::allocator<int>_> recv_cnt;
  vector<vec3f,_std::allocator<vec3f>_> recv_sum;
  undefined1 local_a0 [8];
  vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
  blockers;
  vector<float,_std::allocator<float>_> cluster_radius;
  vector<float,_std::allocator<float>_> cluster_blocker_count;
  int local_38;
  int local_34;
  
  auStack_108[1] = 0x15b3dc;
  github111116::ConsoleLogger::log<char[26]>(&console,(char (*) [26])"per-cluster processing...");
  uVar15 = (ulong)(uint)n;
  if (n < 1) {
    uVar7 = 1;
  }
  else {
    uVar11 = 0;
    iVar13 = 0;
    do {
      iVar8 = clusterids[uVar11];
      if (clusterids[uVar11] < iVar13) {
        iVar8 = iVar13;
      }
      iVar13 = iVar8;
      uVar11 = uVar11 + 1;
    } while (uVar15 != uVar11);
    uVar7 = iVar13 + 1;
  }
  uVar11 = (ulong)uVar7;
  recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0;
  auStack_108[1] = 0x15b433;
  local_34 = n;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_f0,uVar11,
             (value_type_conflict5 *)
             &recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,
             (allocator_type *)
             &blockers.
              super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  blockers.
  super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cluster_radius.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  auStack_108[1] = 0x15b45a;
  std::vector<vec3f,_std::allocator<vec3f>_>::vector
            ((vector<vec3f,_std::allocator<vec3f>_> *)
             &recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage,uVar11,
             (value_type *)
             &blockers.
              super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (allocator_type *)
             &cluster_radius.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  if (0 < local_34) {
    lVar5 = CONCAT44(recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
                     recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._0_4_);
    pdVar14 = &positions->z;
    uVar16 = 0;
    do {
      lVar17 = (long)clusterids[uVar16];
      *(int *)((long)local_f0 + lVar17 * 4) = *(int *)((long)local_f0 + lVar17 * 4) + 1;
      *(float *)(lVar5 + lVar17 * 0xc) =
           ((vec3f *)(pdVar14 + -2))->x + *(float *)(lVar5 + lVar17 * 0xc);
      *(float *)(lVar5 + 4 + lVar17 * 0xc) = pdVar14[-1] + *(float *)(lVar5 + 4 + lVar17 * 0xc);
      *(float *)(lVar5 + 8 + lVar17 * 0xc) = *pdVar14 + *(float *)(lVar5 + 8 + lVar17 * 0xc);
      uVar16 = uVar16 + 1;
      pdVar14 = pdVar14 + 3;
    } while (uVar15 != uVar16);
  }
  lVar5 = -(uVar11 * 0xc + 0xf & 0xfffffffffffffff0);
  pvVar21 = (void *)((long)afStack_f8 + lVar5);
  uVar16 = 0;
  *(undefined8 *)((long)afStack_f8 + lVar5 + -8) = 0x15b520;
  memset(pvVar21,0,((uVar11 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
  lVar17 = 2;
  do {
    auVar6 = local_f0;
    fVar22 = (float)*(int *)((long)local_f0 + uVar16 * 4);
    lVar20 = CONCAT44(recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_,
                      recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._0_4_);
    fVar23 = *(float *)(lVar20 + lVar17 * 4);
    *(ulong *)((long)afStack_f8 + lVar17 * 4 + lVar5 + -8) =
         CONCAT44(*(float *)(lVar20 + -4 + lVar17 * 4) / fVar22,
                  *(float *)(lVar20 + -8 + lVar17 * 4) / fVar22);
    *(float *)((long)pvVar21 + lVar17 * 4) = fVar23 / fVar22;
    if (*(int *)((long)auVar6 + uVar16 * 4) == 0) {
      *(undefined8 *)((long)afStack_f8 + lVar5 + -8) = 0x15b586;
      github111116::ConsoleLogger::debug<char[36]>
                (&console,(char (*) [36])"encountering empty receiver cluster");
      *(undefined8 *)((long)afStack_f8 + lVar17 * 4 + lVar5 + -8) = 0;
      *(undefined4 *)((long)pvVar21 + lVar17 * 4) = 0;
    }
    uVar16 = uVar16 + 1;
    lVar17 = lVar17 + 3;
  } while (uVar11 != uVar16);
  cluster_radius.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0;
  *(undefined8 *)((long)afStack_f8 + lVar5 + -8) = 0x15b5c4;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &blockers.
              super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,uVar11,
             (value_type *)
             &cluster_radius.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(allocator_type *)local_a0);
  if (0 < local_34) {
    pdVar14 = &positions->z;
    uVar16 = 0;
    do {
      ppVar1 = blockers.
               super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      lVar17 = (long)clusterids[uVar16];
      fVar23 = ((vec3f *)(pdVar14 + -2))->x - *(float *)((long)pvVar21 + lVar17 * 0xc);
      fVar22 = pdVar14[-1] - *(float *)((long)afStack_f8 + lVar17 * 0xc + lVar5 + 4);
      fVar23 = (*pdVar14 - *(float *)(local_f0 + lVar17 * 0xc + lVar5)) *
               (*pdVar14 - *(float *)(local_f0 + lVar17 * 0xc + lVar5)) +
               fVar23 * fVar23 + fVar22 * fVar22;
      if (fVar23 < 0.0) {
        *(undefined8 *)((long)afStack_f8 + lVar5 + -8) = 0x15b638;
        fVar23 = sqrtf(fVar23);
      }
      else {
        fVar23 = SQRT(fVar23);
      }
      fVar22 = (&(ppVar1->first).center.x)[lVar17];
      if (fVar23 <= fVar22) {
        fVar23 = fVar22;
      }
      (&((blockers.
          super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).center.x)[lVar17] = fVar23;
      uVar16 = uVar16 + 1;
      pdVar14 = pdVar14 + 3;
    } while (uVar15 != uVar16);
  }
  *(undefined8 *)((long)afStack_f8 + lVar5 + -8) = 0x15b662;
  data = (float *)operator_new__(0x1000000);
  *(undefined8 *)((long)afStack_f8 + lVar5 + -8) = 0x15b670;
  data_00 = (float *)operator_new__(0x3c00000);
  local_a0 = (undefined1  [8])((ulong)(uint)local_a0._4_4_ << 0x20);
  *(undefined8 *)((long)afStack_f8 + lVar5 + -8) = 0x15b694;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             &cluster_radius.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,uVar11,(value_type *)local_a0,
             (allocator_type *)&local_38);
  uVar16 = 0;
  pfVar12 = data_00;
  do {
    uVar3 = *(undefined8 *)((long)pvVar21 + uVar16 * 0xc);
    dVar2 = *(data_t *)(local_f0 + uVar16 * 0xc + lVar5);
    fVar23 = (&((blockers.
                 super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).center.x)[uVar16];
    *(undefined8 *)((long)afStack_f8 + lVar5 + -8) = 0x15b6df;
    cluster_center.z = dVar2;
    cluster_center._0_8_ = uVar3;
    treecut_ratio((vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                   *)local_a0,hierarchy,cluster_center,fVar23,(anonymous_namespace)::theta_max,
                  (anonymous_namespace)::theta_min);
    if ((0x3ff < uVar16) ||
       (uVar9 = ((long)blockers.
                       super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start - (long)local_a0 >> 3) *
                -0x3333333333333333, 0x400 < uVar9)) {
      *(undefined8 *)((long)afStack_f8 + lVar5 + -8) = 0x15b961;
      puVar10 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar10 = "sphere texture overflowing";
      *(undefined1 **)((long)afStack_f8 + lVar5 + -8) = &LAB_0015b97c;
      __cxa_throw(puVar10,&char_const*::typeinfo,0);
    }
    if ((undefined1  [8])
        blockers.
        super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != local_a0) {
      lVar17 = 0;
      pfVar18 = pfVar12;
      do {
        ppVar1 = (pointer)((long)local_a0 + lVar17 * 0x28);
        dVar2 = (ppVar1->first).center.y;
        uVar3 = *(undefined8 *)&(ppVar1->first).center.z;
        pfVar19 = data + uVar16 * 0x1000 + lVar17 * 4;
        pfVar19[0] = (ppVar1->first).center.x;
        pfVar19[1] = dVar2;
        *(undefined8 *)(pfVar19 + 2) = uVar3;
        pfVar4 = (((pointer)((long)local_a0 + lVar17 * 0x28))->second).
                 super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        lVar20 = 0;
        pfVar19 = pfVar18;
        do {
          *pfVar19 = pfVar4[lVar20];
          lVar20 = lVar20 + 1;
          pfVar19 = pfVar19 + 0x100000;
        } while (lVar20 != 0xf);
        lVar17 = lVar17 + 1;
        pfVar18 = pfVar18 + 1;
      } while (lVar17 != uVar9 + (uVar9 == 0));
    }
    *(float *)(CONCAT44(cluster_radius.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_,
                        cluster_radius.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._0_4_) + uVar16 * 4) =
         (float)uVar9;
    *(undefined8 *)((long)afStack_f8 + lVar5 + -8) = 0x15b7bf;
    std::
    vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
    ::~vector((vector<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
               *)local_a0);
    uVar16 = uVar16 + 1;
    pfVar12 = pfVar12 + 0x400;
  } while (uVar16 != uVar11);
  *(undefined8 *)((long)afStack_f8 + lVar5 + -8) = 0x15b7e0;
  (*glad_glActiveTexture)(0x84c4);
  *(undefined8 *)((long)afStack_f8 + lVar5 + -8) = 0x15b808;
  create_2D_float_texture(0x400,0x400,4,data,0x2600,false);
  *(undefined8 *)((long)afStack_f8 + lVar5 + -8) = 0x15b80f;
  (*glad_glActiveTexture)(0x84c5);
  *(undefined8 *)((long)auStack_108 + lVar5) = 0;
  *(undefined8 *)((long)&uStack_110 + lVar5) = 0x15b837;
  create_2D_float_texture_array
            (0x400,0x400,1,0xf,data_00,0x2600,*(bool *)((long)auStack_108 + lVar5));
  *(undefined8 *)((long)afStack_f8 + lVar5 + -8) = 0x15b844;
  operator_delete__(data);
  *(undefined8 *)((long)afStack_f8 + lVar5 + -8) = 0x15b84c;
  operator_delete__(data_00);
  if (0 < local_34) {
    uVar11 = 0;
    do {
      sphcnt[uVar11] =
           (int)*(float *)(CONCAT44(cluster_radius.super__Vector_base<float,_std::allocator<float>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                    cluster_radius.super__Vector_base<float,_std::allocator<float>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) +
                          (long)clusterids[uVar11] * 4);
      uVar11 = uVar11 + 1;
    } while (uVar15 != uVar11);
  }
  pfVar12 = (float *)CONCAT44(cluster_radius.super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                              cluster_radius.super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
  if (pfVar12 ==
      cluster_blocker_count.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_38 = 0;
    iVar13 = 0;
  }
  else {
    iVar13 = 0;
    local_38 = 0;
    do {
      iVar8 = (int)*pfVar12;
      iVar13 = iVar13 + iVar8;
      if (iVar8 < local_38) {
        iVar8 = local_38;
      }
      local_38 = iVar8;
      pfVar12 = pfVar12 + 1;
    } while (pfVar12 !=
             cluster_blocker_count.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start);
    iVar13 = iVar13 * 10;
  }
  *(undefined8 *)((long)afStack_f8 + lVar5 + -8) = 0x15b8d3;
  github111116::ConsoleLogger::log<char[27],int>
            (&console,(char (*) [27])"max #blockers per cluster:",&local_38);
  local_a0 = (undefined1  [8])((double)(iVar13 / (int)uVar7) * 0.1);
  *(undefined8 *)((long)afStack_f8 + lVar5 + -8) = 0x15b903;
  github111116::ConsoleLogger::log<char[27],double>
            (&console,(char (*) [27])"avg #blockers per cluster:",(double *)local_a0);
  pvVar21 = (void *)CONCAT44(cluster_radius.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                             cluster_radius.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
  if (pvVar21 != (void *)0x0) {
    *(undefined8 *)((long)afStack_f8 + lVar5 + -8) = 0x15b911;
    operator_delete(pvVar21);
  }
  ppVar1 = blockers.
           super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (blockers.
      super__Vector_base<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::pair<Sphere,_std::vector<float,_std::allocator<float>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    *(undefined8 *)((long)afStack_f8 + lVar5 + -8) = 0x15b91f;
    operator_delete(ppVar1);
  }
  if ((void *)CONCAT44(recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._4_4_,
                       recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage._0_4_) != (void *)0x0) {
    auStack_108[1] = 0x15b937;
    operator_delete((void *)CONCAT44(recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage._4_4_,
                                     recv_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage._0_4_));
  }
  if (local_f0 != (undefined1  [8])0x0) {
    auStack_108[1] = 0x15b948;
    operator_delete((void *)local_f0);
  }
  return;
}

Assistant:

void cluster_preprocess(int n, const vec3f* positions, const int* clusterids, const SphereTree& hierarchy, int* sphcnt)
{
	console.log("per-cluster processing...");
	// calculate number of clusters
	int maxcluster = 0;
	for (int recv=0; recv<n; ++recv)
		maxcluster = std::max(maxcluster, clusterids[recv]);
	int n_cluster = maxcluster+1;
	// calculate centers of clusters (average over all receivers)
	std::vector<int> recv_cnt(n_cluster,0);
	std::vector<vec3f> recv_sum(n_cluster,0);
	for (int recv=0; recv<n; ++recv) {
		int c = clusterids[recv];
		recv_cnt[c] += 1;
		recv_sum[c] += positions[recv];
	}
	vec3f cluster_center[n_cluster];
	for (int c=0; c<n_cluster; ++c) {
		cluster_center[c] = recv_sum[c] / recv_cnt[c];
		if (recv_cnt[c] == 0) {
			console.debug("encountering empty receiver cluster");
			cluster_center[c] = vec3f(0,0,0);
		}
	}
	// calculate bounding radius of clusters
	std::vector<float> cluster_radius(n_cluster,0);
	for (int recv=0; recv<n; ++recv) {
		int c = clusterids[recv];
		cluster_radius[c] = std::max(cluster_radius[c], norm(positions[recv] - cluster_center[c]));
	}
	// prepare texture data
	static const int texwidth = 1024; // max number of spheres per cluster
	static const int texheight = 1024; // max number of cluster
	float* sphdata = new float[texheight * texwidth * 4];
	float* ratiodata = new float[shorder * texheight * texwidth];
	// assemble bounding sphere nodes for shading each cluster
	std::vector<float> cluster_blocker_count(n_cluster,0);
	for (int c=0; c<n_cluster; ++c) {
		// assemble blockers & calculate ratio vectors
		std::vector<std::pair<Sphere, std::vector<float>>> blockers
			= treecut_ratio(hierarchy, cluster_center[c], cluster_radius[c], theta_max, theta_min);
		if (blockers.size() > texwidth || c >= texheight)
			throw "sphere texture overflowing";
		// store into texture data
		for (int i=0; i<blockers.size(); ++i) {
			memcpy(sphdata + c*texwidth*4 + i*4, &blockers[i].first, sizeof(Sphere));
			for (int k=0; k<shorder; ++k)
				ratiodata[(k * texheight + c) * texwidth + i] = blockers[i].second[k];
		}
		cluster_blocker_count[c] = blockers.size();
	}
	// build texture
	glActiveTexture(GL_TEXTURE4);
	create_2D_float_texture(texwidth, texheight, 4, sphdata, GL_NEAREST);
	glActiveTexture(GL_TEXTURE5);
	create_2D_float_texture_array(texwidth, texheight, 1, shorder, ratiodata, GL_NEAREST);
	delete[] sphdata;
	delete[] ratiodata;
	// assign sphere count of each vertex
	for (int recv=0; recv<n; ++recv)
		sphcnt[recv] = cluster_blocker_count[clusterids[recv]];
	// show stats
	int s = 0, max = 0;
	for (int t: cluster_blocker_count) {
		s += t;
		max = std::max(max, t);
	}
	console.log("max #blockers per cluster:", max);
	console.log("avg #blockers per cluster:", 10 * s / n_cluster * 0.1);
}